

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AddVisibilityPresetFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang)

{
  pointer pcVar1;
  cmake *this_00;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  TargetType TVar4;
  PolicyStatus PVar5;
  int iVar6;
  long *plVar7;
  char *pcVar8;
  char *__s1;
  undefined8 *puVar9;
  ostream *poVar10;
  string *psVar11;
  size_t sVar12;
  cmLocalGenerator *pcVar13;
  size_type *psVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  PolicyID id;
  _Alloc_hider _Var16;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar17;
  string compileOption;
  string l;
  string flagDefine;
  string warnCMP0063;
  string option;
  cmGeneratorTarget *local_280;
  char **local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  cmListFileBacktrace local_230;
  string local_1f0;
  string *local_1d0;
  char *local_1c8;
  long local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  if (lang->_M_string_length == 0) {
    return;
  }
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8 = '\0';
  local_280 = target;
  local_1d0 = flags;
  TVar4 = cmGeneratorTarget::GetType(target);
  if (((TVar4 == SHARED_LIBRARY) ||
      (TVar4 = cmGeneratorTarget::GetType(local_280), TVar4 == MODULE_LIBRARY)) ||
     (bVar3 = cmGeneratorTarget::IsExecutableWithExports(local_280), bVar3)) {
LAB_0037fe66:
    local_278 = (char **)0x0;
  }
  else {
    PVar5 = cmPolicies::PolicyMap::Get(&local_280->PolicyMap,CMP0063);
    if (PVar5 == OLD) goto LAB_0038065f;
    if (PVar5 != WARN) goto LAB_0037fe66;
    local_278 = &local_1c8;
  }
  pcVar2 = local_280;
  pcVar1 = (lang->_M_dataplus)._M_p;
  local_230.Context.Name._M_dataplus._M_p = (pointer)&local_230.Context.Name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,pcVar1,pcVar1 + lang->_M_string_length);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 "CMAKE_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_230);
  plVar7 = (long *)std::__cxx11::string::append(local_1a8);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  psVar14 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_250.field_2._M_allocated_capacity = *psVar14;
    local_250.field_2._8_8_ = plVar7[3];
  }
  else {
    local_250.field_2._M_allocated_capacity = *psVar14;
    local_250._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_250._M_string_length = plVar7[1];
  *plVar7 = (long)psVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
  }
  pcVar8 = cmMakefile::GetDefinition(this->Makefile,&local_250);
  if (pcVar8 != (char *)0x0) {
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,local_230.Context.Name._M_dataplus._M_p,
               (char *)(local_230.Context.Name._M_string_length +
                       (long)local_230.Context.Name._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_1f0);
    __s1 = cmGeneratorTarget::GetProperty(pcVar2,&local_1f0);
    if (__s1 != (char *)0x0) {
      if (local_278 == (char **)0x0) {
        iVar6 = strcmp(__s1,"hidden");
        if (((iVar6 == 0) || (iVar6 = strcmp(__s1,"default"), iVar6 == 0)) ||
           ((iVar6 = strcmp(__s1,"protected"), iVar6 == 0 ||
            (iVar6 = strcmp(__s1,"internal"), iVar6 == 0)))) {
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          sVar12 = strlen(pcVar8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_270,pcVar8,pcVar8 + sVar12);
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar15) {
            local_198[0]._0_8_ = paVar15->_M_allocated_capacity;
            local_198[0]._8_8_ = puVar9[3];
            local_1a8._0_8_ = local_198;
          }
          else {
            local_198[0]._0_8_ = paVar15->_M_allocated_capacity;
            local_1a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar9;
          }
          local_1a8._8_8_ = puVar9[1];
          *puVar9 = paVar15;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,
                            (ulong)(local_270.field_2._M_allocated_capacity + 1));
          }
          (*this->_vptr_cmLocalGenerator[5])(this,local_1d0,local_1a8);
          local_270.field_2._M_allocated_capacity = local_198[0]._M_allocated_capacity;
          _Var16._M_p = (pointer)local_1a8._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._0_8_ != local_198) goto LAB_00380293;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target ",7);
          psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar2);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar11->_M_dataplus)._M_p,
                               psVar11->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," uses unsupported value \"",0x19);
          sVar12 = strlen(__s1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,__s1,sVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" for ",6);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(local_270._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,
                            (ulong)(local_270.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      else {
        std::operator+(&local_270,"  ",&local_1f0);
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar15) {
          local_198[0]._0_8_ = paVar15->_M_allocated_capacity;
          local_198[0]._8_8_ = puVar9[3];
          local_1a8._0_8_ = local_198;
        }
        else {
          local_198[0]._0_8_ = paVar15->_M_allocated_capacity;
          local_1a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar9;
        }
        local_1a8._8_8_ = puVar9[1];
        *puVar9 = paVar15;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_278,local_1a8._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
        }
        _Var16._M_p = local_270._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
LAB_00380293:
          operator_delete(_Var16._M_p,(ulong)(local_270.field_2._M_allocated_capacity + 1));
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.Context.Name._M_dataplus._M_p != &local_230.Context.Name.field_2) {
    operator_delete(local_230.Context.Name._M_dataplus._M_p,
                    (ulong)(local_230.Context.Name.field_2._M_allocated_capacity + 1));
  }
  iVar6 = std::__cxx11::string::compare((char *)lang);
  pcVar2 = local_280;
  if (iVar6 == 0) {
    local_1a8._0_8_ = local_198;
    local_230.Context.Name._M_dataplus._M_p = (pointer)0x33;
    local_1a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1a8,(ulong)&local_230);
    local_198[0]._M_allocated_capacity = local_230.Context.Name._M_dataplus._M_p;
    *(char *)(local_1a8._0_8_ + 0x20) = 'L';
    *(char *)(local_1a8._0_8_ + 0x21) = 'I';
    *(char *)(local_1a8._0_8_ + 0x22) = 'T';
    *(char *)(local_1a8._0_8_ + 0x23) = 'Y';
    *(char *)(local_1a8._0_8_ + 0x24) = '_';
    *(char *)(local_1a8._0_8_ + 0x25) = 'I';
    *(char *)(local_1a8._0_8_ + 0x26) = 'N';
    *(char *)(local_1a8._0_8_ + 0x27) = 'L';
    *(char *)(local_1a8._0_8_ + 0x28) = 'I';
    *(char *)(local_1a8._0_8_ + 0x29) = 'N';
    *(char *)(local_1a8._0_8_ + 0x2a) = 'E';
    *(char *)(local_1a8._0_8_ + 0x2b) = 'S';
    *(char *)(local_1a8._0_8_ + 0x2c) = '_';
    *(char *)(local_1a8._0_8_ + 0x2d) = 'H';
    *(char *)(local_1a8._0_8_ + 0x2e) = 'I';
    *(char *)(local_1a8._0_8_ + 0x2f) = 'D';
    *(char *)(local_1a8._0_8_ + 0x10) = 'E';
    *(char *)(local_1a8._0_8_ + 0x11) = '_';
    *(char *)(local_1a8._0_8_ + 0x12) = 'O';
    *(char *)(local_1a8._0_8_ + 0x13) = 'P';
    *(char *)(local_1a8._0_8_ + 0x14) = 'T';
    *(char *)(local_1a8._0_8_ + 0x15) = 'I';
    *(char *)(local_1a8._0_8_ + 0x16) = 'O';
    *(char *)(local_1a8._0_8_ + 0x17) = 'N';
    *(char *)(local_1a8._0_8_ + 0x18) = 'S';
    *(char *)(local_1a8._0_8_ + 0x19) = '_';
    *(char *)(local_1a8._0_8_ + 0x1a) = 'V';
    *(char *)(local_1a8._0_8_ + 0x1b) = 'I';
    *(char *)(local_1a8._0_8_ + 0x1c) = 'S';
    *(char *)(local_1a8._0_8_ + 0x1d) = 'I';
    *(char *)(local_1a8._0_8_ + 0x1e) = 'B';
    *(char *)(local_1a8._0_8_ + 0x1f) = 'I';
    *(undefined8 *)local_1a8._0_8_ = 0x58435f454b414d43;
    *(char *)(local_1a8._0_8_ + 8) = 'X';
    *(char *)(local_1a8._0_8_ + 9) = '_';
    *(char *)(local_1a8._0_8_ + 10) = 'C';
    *(char *)(local_1a8._0_8_ + 0xb) = 'O';
    *(char *)(local_1a8._0_8_ + 0xc) = 'M';
    *(char *)(local_1a8._0_8_ + 0xd) = 'P';
    *(char *)(local_1a8._0_8_ + 0xe) = 'I';
    *(char *)(local_1a8._0_8_ + 0xf) = 'L';
    *(char *)(local_1a8._0_8_ + 0x2f) = 'D';
    *(char *)(local_1a8._0_8_ + 0x30) = 'D';
    *(char *)(local_1a8._0_8_ + 0x31) = 'E';
    *(char *)(local_1a8._0_8_ + 0x32) = 'N';
    local_1a8._8_8_ = local_230.Context.Name._M_dataplus._M_p;
    *(char *)(local_1a8._0_8_ + (long)local_230.Context.Name._M_dataplus._M_p) = '\0';
    pcVar8 = cmMakefile::GetDefinition(this->Makefile,(string *)local_1a8);
    if (pcVar8 != (char *)0x0) {
      local_230.Context.Name._M_dataplus._M_p = (pointer)&local_230.Context.Name.field_2;
      local_250._M_dataplus._M_p = (pointer)0x19;
      local_230.Context.Name._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)&local_250);
      local_230.Context.Name.field_2._M_allocated_capacity = (size_type)local_250._M_dataplus._M_p;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 9) = 'Y';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 10) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0xb) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0xc) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0xd) = 'L';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0xe) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0xf) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0x10) = 'E';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0x11) = 'S';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0x12) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0x13) = 'H';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0x14) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0x15) = 'D';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0x16) = 'D';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0x17) = 'E';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0x18) = 'N';
      *(undefined8 *)local_230.Context.Name._M_dataplus._M_p = 0x494c494249534956;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 8) = 'T';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 9) = 'Y';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 10) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0xb) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0xc) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0xd) = 'L';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0xe) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.Context.Name._M_dataplus._M_p + 0xf) = 'N';
      local_230.Context.Name._M_string_length = (size_type)local_250._M_dataplus._M_p;
      local_230.Context.Name._M_dataplus._M_p[(long)local_250._M_dataplus._M_p] = '\0';
      bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,(string *)&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230.Context.Name._M_dataplus._M_p != &local_230.Context.Name.field_2) {
        operator_delete(local_230.Context.Name._M_dataplus._M_p,
                        (ulong)(local_230.Context.Name.field_2._M_allocated_capacity + 1));
      }
      if (bVar3) {
        if (local_278 == (char **)0x0) {
          (*this->_vptr_cmLocalGenerator[6])(this,local_1d0,pcVar8);
        }
        else {
          std::__cxx11::string::append((char *)local_278);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
    }
  }
  if ((local_1c0 != 0) &&
     (pVar17 = std::
               _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
               ::_M_insert_unique<cmGeneratorTarget_const*const&>
                         ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                           *)&this->WarnCMP0063,&local_280),
     ((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&local_230,(cmPolicies *)0x3f,id);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_230.Context.Name._M_dataplus._M_p,
                         local_230.Context.Name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nTarget \"",9);
    psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(local_280);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" of type \"",0xb);
    TVar4 = cmGeneratorTarget::GetType(local_280);
    pcVar8 = cmState::GetTargetTypeName(TVar4);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
    }
    else {
      sVar12 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"\" has the following visibility properties set for ",0x32);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,":\n",2);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_1c8,local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"For compatibility CMake is not honoring them for this target.",0x3d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.Context.Name._M_dataplus._M_p != &local_230.Context.Name.field_2) {
      operator_delete(local_230.Context.Name._M_dataplus._M_p,
                      (ulong)(local_230.Context.Name.field_2._M_allocated_capacity + 1));
    }
    pcVar13 = cmGeneratorTarget::GetLocalGenerator(local_280);
    this_00 = pcVar13->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace(&local_230,local_280);
    cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_250,&local_230,false);
    cmListFileBacktrace::~cmListFileBacktrace(&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
LAB_0038065f:
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator
::AddVisibilityPresetFlags(std::string &flags, cmGeneratorTarget const* target,
                            const std::string& lang)
{
  if (lang.empty())
    {
    return;
    }

  std::string warnCMP0063;
  std::string *pWarnCMP0063 = 0;
  if (target->GetType() != cmState::SHARED_LIBRARY &&
      target->GetType() != cmState::MODULE_LIBRARY &&
      !target->IsExecutableWithExports())
    {
    switch (target->GetPolicyStatusCMP0063())
      {
      case cmPolicies::OLD:
        return;
      case cmPolicies::WARN:
        pWarnCMP0063 = &warnCMP0063;
        break;
      default:
        break;
      }
    }

  AddVisibilityCompileOption(flags, target, this, lang, pWarnCMP0063);

  if(lang == "CXX")
    {
    AddInlineVisibilityCompileOption(flags, target, this, pWarnCMP0063);
    }

  if (!warnCMP0063.empty() &&
      this->WarnCMP0063.insert(target).second)
    {
    std::ostringstream w;
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0063) << "\n"
      "Target \"" << target->GetName() << "\" of "
      "type \"" << cmState::GetTargetTypeName(target->GetType()) << "\" "
      "has the following visibility properties set for " << lang << ":\n" <<
      warnCMP0063 <<
      "For compatibility CMake is not honoring them for this target.";
    target->GetLocalGenerator()->GetCMakeInstance()
      ->IssueMessage(cmake::AUTHOR_WARNING, w.str(),
                     target->GetBacktrace());
    }
}